

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
_IPC_Decoder<perfetto::protos::gen::DetachResponse>(string *proto_data)

{
  bool bVar1;
  DetachResponse *this;
  pointer this_00;
  __uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
  in_RSI;
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_> local_20;
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_> msg;
  string *proto_data_local;
  
  msg._M_t.
  super___uniq_ptr_impl<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>.
  _M_t.
  super__Tuple_impl<0UL,_protozero::CppMessageObj_*,_std::default_delete<protozero::CppMessageObj>_>
  .super__Head_base<0UL,_protozero::CppMessageObj_*,_false>._M_head_impl =
       (__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
        )(__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
          )in_RSI.
           super___uniq_ptr_impl<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
           ._M_t.
           super__Tuple_impl<0UL,_protozero::CppMessageObj_*,_std::default_delete<protozero::CppMessageObj>_>
           .super__Head_base<0UL,_protozero::CppMessageObj_*,_false>._M_head_impl;
  this = (DetachResponse *)operator_new(0x30);
  perfetto::protos::gen::DetachResponse::DetachResponse(this);
  std::unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>>::
  unique_ptr<std::default_delete<protozero::CppMessageObj>,void>
            ((unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>> *)
             &local_20,(pointer)this);
  this_00 = perfetto::std::
            unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>::
            operator->(&local_20);
  bVar1 = protozero::CppMessageObj::ParseFromString
                    (this_00,(string *)
                             msg._M_t.
                             super___uniq_ptr_impl<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_protozero::CppMessageObj_*,_std::default_delete<protozero::CppMessageObj>_>
                             .super__Head_base<0UL,_protozero::CppMessageObj_*,_false>._M_head_impl)
  ;
  if (bVar1) {
    perfetto::std::
    unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>::unique_ptr
              ((unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
                *)proto_data,&local_20);
  }
  else {
    std::unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>>::
    unique_ptr<std::default_delete<protozero::CppMessageObj>,void>
              ((unique_ptr<protozero::CppMessageObj,std::default_delete<protozero::CppMessageObj>> *
               )proto_data,(nullptr_t)0x0);
  }
  perfetto::std::
  unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
          )(__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
            )proto_data;
}

Assistant:

::std::unique_ptr<::perfetto::ipc::ProtoMessage> _IPC_Decoder(
    const std::string& proto_data) {
  ::std::unique_ptr<::perfetto::ipc::ProtoMessage> msg(new T());
  if (msg->ParseFromString(proto_data))
    return msg;
  return nullptr;
}